

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall
CVmRun::get_prop(CVmRun *this,uint caller_ofs,vm_val_t *target_obj,vm_prop_id_t target_prop,
                vm_val_t *self,uint argc,vm_rcdesc *rc)

{
  int iVar1;
  uchar *puVar2;
  vm_val_t *in_RDX;
  vm_rcdesc *unaff_RBX;
  vm_val_t **in_RDI;
  vm_val_t *in_R8;
  int in_R9D;
  vm_val_t new_self;
  int found;
  vm_obj_id_t srcobj;
  vm_val_t val;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vm_val_t *in_stack_ffffffffffffffa0;
  vm_obj_id_t *in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb2;
  vm_prop_id_t target_prop_00;
  vm_obj_id_t in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  vm_prop_id_t in_stack_ffffffffffffffbe;
  uint in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  vm_obj_id_t in_stack_ffffffffffffffe8;
  uint argc_00;
  vm_val_t **ppvVar3;
  
  ppvVar3 = in_RDI;
  iVar1 = get_prop_no_eval((vm_val_t **)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbe,
                           (uint *)CONCAT44(in_stack_ffffffffffffffb4,
                                            CONCAT22(in_stack_ffffffffffffffb2,
                                                     in_stack_ffffffffffffffb0)),
                           in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RDI,in_R8);
  argc_00 = (uint)ppvVar3;
  target_prop_00 = (vm_prop_id_t)((uint)iVar1 >> 0x10);
  if ((iVar1 == 0) && (G_predef_X.prop_not_defined_prop != 0)) {
    iVar1 = get_prop_no_eval((vm_val_t **)
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             in_stack_ffffffffffffffbe,
                             (uint *)((ulong)in_stack_ffffffffffffffb4 << 0x20),
                             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RDI,in_R8);
    target_prop_00 = (vm_prop_id_t)((uint)iVar1 >> 0x10);
    if ((iVar1 != 0) &&
       (((in_stack_ffffffffffffffb8 == 0xb || (in_stack_ffffffffffffffb8 == 0x11)) ||
        (in_stack_ffffffffffffffb8 == 0x12)))) {
      push_prop((CVmRun *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                (vm_prop_id_t)((ulong)&stack0xffffffffffffffa0 >> 0x30));
      in_R9D = in_R9D + 1;
    }
  }
  puVar2 = eval_prop_val((CVmRun *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                         (vm_val_t *)
                         CONCAT26(in_stack_ffffffffffffffbe,
                                  CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
                         in_stack_ffffffffffffffb4,target_prop_00,in_RDX,in_stack_ffffffffffffffe8,
                         argc_00,unaff_RBX);
  return puVar2;
}

Assistant:

const uchar *CVmRun::get_prop(VMG_ uint caller_ofs,
                              const vm_val_t *target_obj,
                              vm_prop_id_t target_prop,
                              const vm_val_t *self, uint argc,
                              const vm_rcdesc *rc)
{
    vm_val_t val;
    vm_obj_id_t srcobj;
    int found;
    vm_val_t new_self;

    /* find the property without evaluating it */
    found = get_prop_no_eval(vmg_ &target_obj, target_prop,
                             &argc, &srcobj, &val, &self, &new_self);

    /* if we didn't find it, try propNotDefined */
    if (!found && G_predef->prop_not_defined_prop != VM_INVALID_PROP)
    {
        /* look up propNotDefined */
        found = get_prop_no_eval(vmg_ &target_obj,
                                 G_predef->prop_not_defined_prop,
                                 &argc, &srcobj, &val, &self, &new_self);

        /* if we found a method, set up to call it */
        if (found && (val.typ == VM_CODEOFS
                      || val.typ == VM_OBJX
                      || val.typ == VM_BIFPTRX))
        {
            /* 
             *   add the target property as the additional first argument to
             *   propNotDefined (we push backwards, so this will conveniently
             *   become the new first argument) 
             */
            push_prop(vmg_ target_prop);
            
            /* count the additional argument */
            ++argc;

            /* the property we're actually calling now is propNotDefined */
            target_prop = G_predef->prop_not_defined_prop;
        }
    }
    
    /* evaluate whatever we found or didn't find */
    return eval_prop_val(vmg_ found, caller_ofs, &val, self->val.obj,
                         target_prop, target_obj, srcobj, argc, rc);
}